

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_ManEval(Zyx_Man_t *p)

{
  bmcg_sat_solver *s;
  int iVar1;
  int iVar2;
  word *pwVar3;
  word *pwVar4;
  word *pIn2;
  word *local_98;
  int nFanins;
  word *pSpec;
  word *pFaninsW [6];
  int iMint;
  int j;
  int k;
  int i;
  Zyx_Man_t *p_local;
  
  for (j = p->pPars->nVars; j < p->nObjs; j = j + 1) {
    iVar1 = Zyx_ManCollectFanins(p,j);
    if (iVar1 != p->pPars->nLutSize) {
      __assert_fail("nFanins == p->pPars->nLutSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x4b5,"int Zyx_ManEval(Zyx_Man_t *)");
    }
    for (iMint = 0; iMint < p->pPars->nLutSize; iMint = iMint + 1) {
      pwVar3 = Zyx_ManTruth(p,p->pFanins[j][iMint]);
      pFaninsW[(long)iMint + -1] = pwVar3;
    }
    if (p->pPars->fMajority == 0) {
      pwVar3 = Zyx_ManTruth(p,j);
      Abc_TtConst0(pwVar3,p->nWords);
      for (iMint = 1; iMint <= p->LutMask; iMint = iMint + 1) {
        s = p->pSat;
        iVar1 = Zyx_FuncVar(p,j,iMint);
        iVar1 = bmcg_sat_solver_read_cex_varvalue(s,iVar1);
        if (iVar1 != 0) {
          pwVar3 = Zyx_ManTruth(p,p->nObjs);
          Abc_TtConst1(pwVar3,p->nWords);
          for (pFaninsW[5]._4_4_ = 0; pFaninsW[5]._4_4_ < p->pPars->nLutSize;
              pFaninsW[5]._4_4_ = pFaninsW[5]._4_4_ + 1) {
            pwVar3 = Zyx_ManTruth(p,p->nObjs);
            pwVar4 = Zyx_ManTruth(p,p->nObjs);
            Abc_TtAndCompl(pwVar3,pwVar4,0,pFaninsW[(long)pFaninsW[5]._4_4_ + -1],
                           (uint)(((iMint >> ((byte)pFaninsW[5]._4_4_ & 0x1f) & 1U) != 0 ^ 0xffU) &
                                 1),p->nWords);
          }
          pwVar3 = Zyx_ManTruth(p,j);
          pwVar4 = Zyx_ManTruth(p,j);
          pIn2 = Zyx_ManTruth(p,p->nObjs);
          Abc_TtOr(pwVar3,pwVar4,pIn2,p->nWords);
        }
      }
    }
    else {
      pwVar3 = Zyx_ManTruth(p,j);
      Abc_TtMaj(pwVar3,pSpec,pFaninsW[0],pFaninsW[1],p->nWords);
    }
  }
  if (p->pPars->fMajority == 0) {
    local_98 = p->pTruth;
  }
  else {
    local_98 = Zyx_ManTruth(p,p->nObjs);
  }
  if (p->pPars->fMajority == 0) {
    if ((Zyx_ManEval::Flag == 0) || (p->pPars->nVars < 6)) {
      pwVar3 = Zyx_ManTruth(p,p->nObjs + -1);
      pFaninsW[5]._0_4_ = Abc_TtFindFirstDiffBit(pwVar3,local_98,p->pPars->nVars);
    }
    else {
      pwVar3 = Zyx_ManTruth(p,p->nObjs + -1);
      pFaninsW[5]._0_4_ = Abc_TtFindLastDiffBit(pwVar3,local_98,p->pPars->nVars);
    }
    if (1 << ((byte)p->pPars->nVars & 0x1f) <= (int)pFaninsW[5]) {
      __assert_fail("iMint < (1 << p->pPars->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x4d7,"int Zyx_ManEval(Zyx_Man_t *)");
    }
    p_local._4_4_ = (int)pFaninsW[5];
  }
  else {
    for (j = 0; iVar1 = Vec_IntSize(p->vMidMints), j < iVar1; j = j + 1) {
      pFaninsW[5]._0_4_ = Vec_IntEntry(p->vMidMints,j);
      iVar1 = Abc_TtGetBit(local_98,(int)pFaninsW[5]);
      pwVar3 = Zyx_ManTruth(p,p->nObjs + -1);
      iVar2 = Abc_TtGetBit(pwVar3,(int)pFaninsW[5]);
      if (iVar1 != iVar2) {
        return (int)pFaninsW[5];
      }
    }
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Zyx_ManEval( Zyx_Man_t * p )
{
    static int Flag = 0;
    //abctime clk = Abc_Clock();
    int i, k, j, iMint; word * pFaninsW[6], * pSpec;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        assert( nFanins == p->pPars->nLutSize );
        for ( k = 0; k < p->pPars->nLutSize; k++ )
            pFaninsW[k] = Zyx_ManTruth( p, p->pFanins[i][k] );
        if ( p->pPars->fMajority )
            Abc_TtMaj( Zyx_ManTruth(p, i), pFaninsW[0], pFaninsW[1], pFaninsW[2], p->nWords );
        else
        {
            Abc_TtConst0( Zyx_ManTruth(p, i), p->nWords );
            for ( k = 1; k <= p->LutMask; k++ )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i, k)) )
                {
                    Abc_TtConst1( Zyx_ManTruth(p, p->nObjs), p->nWords );
                    for ( j = 0; j < p->pPars->nLutSize; j++ )
                        Abc_TtAndCompl( Zyx_ManTruth(p, p->nObjs), Zyx_ManTruth(p, p->nObjs), 0, pFaninsW[j], !((k >> j) & 1), p->nWords );
                    Abc_TtOr( Zyx_ManTruth(p, i), Zyx_ManTruth(p, i), Zyx_ManTruth(p, p->nObjs), p->nWords );
                }
        }
    }
    pSpec = p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : p->pTruth;
    if ( p->pPars->fMajority )
    {
        Vec_IntForEachEntry( p->vMidMints, iMint, i )
            if ( Abc_TtGetBit(pSpec, iMint) != Abc_TtGetBit(Zyx_ManTruth(p, p->nObjs-1), iMint) )
                return iMint;
        return -1;
    }
    else
    {
        if ( Flag && p->pPars->nVars >= 6 )
            iMint = Abc_TtFindLastDiffBit( Zyx_ManTruth(p, p->nObjs-1), pSpec, p->pPars->nVars );
        else
            iMint = Abc_TtFindFirstDiffBit( Zyx_ManTruth(p, p->nObjs-1), pSpec, p->pPars->nVars );
    }
    //Flag ^= 1;
    assert( iMint < (1 << p->pPars->nVars) );
    //p->clkEval += Abc_Clock() - clk;
    return iMint;
}